

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::protos::gen::JavaHprofConfig::~JavaHprofConfig(JavaHprofConfig *this)

{
  JavaHprofConfig *this_local;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__JavaHprofConfig_009c1490;
  ::std::__cxx11::string::~string((string *)&this->unknown_fields_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->ignored_types_);
  protozero::CopyablePtr<perfetto::protos::gen::JavaHprofConfig_ContinuousDumpConfig>::~CopyablePtr
            (&this->continuous_dump_config_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->target_installed_by_);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&this->pid_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->process_cmdline_);
  protozero::CppMessageObj::~CppMessageObj(&this->super_CppMessageObj);
  return;
}

Assistant:

JavaHprofConfig::~JavaHprofConfig() = default;